

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type loc;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if ((2 < sVar3) &&
     (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                      (char *)in_stack_ffffffffffffff98), iVar2 == 0)) {
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffff80,
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    bVar1 = valid_first_char<char>(*pvVar4);
    if (bVar1) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f,0x1dea40);
      if (sVar3 == 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        ::std::__cxx11::string::~string(in_stack_ffffffffffffff80);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff80,
                   (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        ::std::__cxx11::string::~string(in_stack_ffffffffffffff80);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        ::std::__cxx11::string::~string(in_stack_ffffffffffffff80);
      }
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.compare(0, 2, "--") == 0 && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}